

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O0

Curl_addrinfo * Curl_resolver_getaddrinfo(connectdata *conn,char *hostname,int port,int *waitp)

{
  Curl_easy *data_00;
  time_t *ptVar1;
  _Bool _Var2;
  int iVar3;
  curltime cVar4;
  undefined4 uStack_9c;
  undefined1 local_94 [8];
  in6_addr in6;
  in_addr in;
  resdata *reslv;
  Curl_easy *data;
  int pf;
  char sbuf [12];
  addrinfo hints;
  int *waitp_local;
  int port_local;
  char *hostname_local;
  connectdata *conn_local;
  
  data._0_4_ = 2;
  data_00 = conn->data;
  unique0x00012000 = (time_t *)(data_00->state).resolver;
  *waitp = 0;
  iVar3 = inet_pton(2,hostname,(void *)((long)&in6.__in6_u + 8));
  if (iVar3 < 1) {
    iVar3 = inet_pton(10,hostname,local_94);
    if (iVar3 < 1) {
      if (conn->ip_version == 1) {
        data._0_4_ = 2;
      }
      else if (conn->ip_version == 2) {
        data._0_4_ = 10;
      }
      else {
        data._0_4_ = 0;
      }
      if ((int)data != 2) {
        _Var2 = Curl_ipv6works();
        if (!_Var2) {
          data._0_4_ = 2;
        }
      }
      memset(sbuf + 4,0,0x30);
      sbuf[8] = data._0_1_;
      sbuf[9] = data._1_1_;
      sbuf[10] = data._2_1_;
      sbuf[0xb] = data._3_1_;
      curl_msnprintf((char *)((long)&data + 4),0xc,"%d",(ulong)(uint)port);
      ptVar1 = stack0xffffffffffffff80;
      cVar4 = Curl_now();
      *ptVar1 = cVar4.tv_sec;
      ptVar1[1] = CONCAT44(uStack_9c,cVar4.tv_usec);
      _Var2 = init_resolve_thread(conn,hostname,port,(addrinfo *)(sbuf + 4));
      if (_Var2) {
        *waitp = 1;
        conn_local = (connectdata *)0x0;
      }
      else {
        Curl_failf(data_00,"getaddrinfo() thread failed to start\n");
        conn_local = (connectdata *)0x0;
      }
    }
    else {
      conn_local = (connectdata *)Curl_ip2addr(10,local_94,hostname,port);
    }
  }
  else {
    conn_local = (connectdata *)Curl_ip2addr(2,(void *)((long)&in6.__in6_u + 8),hostname,port);
  }
  return (Curl_addrinfo *)conn_local;
}

Assistant:

Curl_addrinfo *Curl_resolver_getaddrinfo(struct connectdata *conn,
                                         const char *hostname,
                                         int port,
                                         int *waitp)
{
  struct addrinfo hints;
  char sbuf[12];
  int pf = PF_INET;
  struct Curl_easy *data = conn->data;
  struct resdata *reslv = (struct resdata *)data->state.resolver;

  *waitp = 0; /* default to synchronous response */

#ifndef USE_RESOLVE_ON_IPS
  {
    struct in_addr in;
    /* First check if this is an IPv4 address string */
    if(Curl_inet_pton(AF_INET, hostname, &in) > 0)
      /* This is a dotted IP address 123.123.123.123-style */
      return Curl_ip2addr(AF_INET, &in, hostname, port);
  }
#ifdef CURLRES_IPV6
  {
    struct in6_addr in6;
    /* check if this is an IPv6 address string */
    if(Curl_inet_pton(AF_INET6, hostname, &in6) > 0)
      /* This is an IPv6 address literal */
      return Curl_ip2addr(AF_INET6, &in6, hostname, port);
  }
#endif /* CURLRES_IPV6 */
#endif /* !USE_RESOLVE_ON_IPS */

#ifdef CURLRES_IPV6
  /*
   * Check if a limited name resolve has been requested.
   */
  switch(conn->ip_version) {
  case CURL_IPRESOLVE_V4:
    pf = PF_INET;
    break;
  case CURL_IPRESOLVE_V6:
    pf = PF_INET6;
    break;
  default:
    pf = PF_UNSPEC;
    break;
  }

  if((pf != PF_INET) && !Curl_ipv6works())
    /* The stack seems to be a non-IPv6 one */
    pf = PF_INET;
#endif /* CURLRES_IPV6 */

  memset(&hints, 0, sizeof(hints));
  hints.ai_family = pf;
  hints.ai_socktype = conn->socktype;

  msnprintf(sbuf, sizeof(sbuf), "%d", port);

  reslv->start = Curl_now();
  /* fire up a new resolver thread! */
  if(init_resolve_thread(conn, hostname, port, &hints)) {
    *waitp = 1; /* expect asynchronous response */
    return NULL;
  }

  failf(data, "getaddrinfo() thread failed to start\n");
  return NULL;

}